

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_outputs_tests.cpp
# Opt level: O0

CoinSelectionParams *
wallet::group_outputs_tests::makeSelectionParams(FastRandomContext *rand,bool avoid_partial_spends)

{
  long lVar1;
  CFeeRate effective_feerate;
  uint uVar2;
  byte in_DL;
  _Optional_payload_base<int> in_RDI;
  long in_FS_OFFSET;
  CFeeRate *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff94;
  CFeeRate in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  _Optional_payload_base<int> max_tx_weight;
  CAmount local_28;
  undefined8 local_20;
  _Storage<int,_true> in_stack_fffffffffffffff0;
  undefined4 uStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  max_tx_weight = in_RDI;
  CFeeRate::CFeeRate<int>(in_stack_ffffffffffffff78,0);
  CFeeRate::CFeeRate<int>(in_stack_ffffffffffffff78,0);
  CFeeRate::CFeeRate<int>(in_stack_ffffffffffffff78,0);
  uVar2 = (uint)(in_DL & 1);
  std::optional<int>::optional((optional<int> *)&stack0xfffffffffffffff0);
  effective_feerate.nSatoshisPerK._4_4_ = uVar2;
  effective_feerate.nSatoshisPerK._0_4_ = in_stack_ffffffffffffffb0;
  CoinSelectionParams::CoinSelectionParams
            ((CoinSelectionParams *)CONCAT44(uStack_c,in_stack_fffffffffffffff0._M_value),
             (FastRandomContext *)(CONCAT44(in_stack_ffffffffffffff94,uVar2) & 0xffffffff00000001),
             in_stack_ffffffffffffff8c,0,local_28,effective_feerate,(CFeeRate)in_RDI,
             in_stack_ffffffffffffffa0,in_stack_fffffffffffffff0._M_value,
             SUB81((ulong)local_20 >> 0x38,0),(optional<int>)max_tx_weight);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (CoinSelectionParams *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CoinSelectionParams makeSelectionParams(FastRandomContext& rand, bool avoid_partial_spends)
{
    return CoinSelectionParams{
            rand,
            /*change_output_size=*/ 0,
            /*change_spend_size=*/ 0,
            /*min_change_target=*/ CENT,
            /*effective_feerate=*/ CFeeRate(0),
            /*long_term_feerate=*/ CFeeRate(0),
            /*discard_feerate=*/ CFeeRate(0),
            /*tx_noinputs_size=*/ 0,
            /*avoid_partial=*/ avoid_partial_spends,
    };
}